

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bdshemu.c
# Opt level: O0

ND_BOOL ShemuBmpStateCheck(ND_UINT8 *Bitmap,ND_UINT64 Size,ND_UINT64 Start,ND_UINT64 Count,
                          ND_UINT8 Flags)

{
  ulong local_40;
  ND_UINT64 i;
  ND_UINT8 Flags_local;
  ND_UINT64 Count_local;
  ND_UINT64 Start_local;
  ND_UINT64 Size_local;
  ND_UINT8 *Bitmap_local;
  
  if ((((Bitmap != (ND_UINT8 *)0x0) && (Start < Size)) && (Count <= Size)) &&
     (Start + Count <= Size)) {
    for (local_40 = 0; local_40 < Count; local_40 = local_40 + 1) {
      if ((Bitmap[Start + local_40] & Flags) != 0) {
        return '\x01';
      }
    }
  }
  return '\0';
}

Assistant:

ND_BOOL
ShemuBmpStateCheck(
    ND_UINT8 *Bitmap,
    ND_UINT64 Size,
    ND_UINT64 Start,
    ND_UINT64 Count,
    ND_UINT8 Flags
    )
//
// Check if any of the state bytes in the Bitmap has any of the Flags set.
// 
// @returns ND_TRUE if any state byte contains the indicated Flags.
//
{
    ND_UINT64 i;

    if (ND_NULL == Bitmap || Start >= Size || Count > Size || Start + Count > Size)
    {
        return ND_FALSE;
    }

    for (i = 0; i < Count; i++)
    {
        if (Bitmap[Start + i] & Flags)
        {
            return ND_TRUE;
        }
    }

    return ND_FALSE;
}